

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::extMul<4ul,short,int,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  int32_t iVar1;
  int32_t iVar2;
  reference pvVar3;
  reference this_00;
  Literal *val;
  Literal local_238;
  size_type local_220;
  size_t idx;
  size_t i;
  LaneArray<4UL> result;
  undefined1 local_1a0 [8];
  LaneArray<4UL_*_2> rhs;
  LaneArray<4UL_*_2> lhs;
  Literal *b_local;
  Literal *a_local;
  
  getLanes<short,8>((LaneArray<8> *)&rhs._M_elems[7].type,this,a);
  getLanes<short,8>((LaneArray<8> *)local_1a0,(wasm *)a,val);
  std::array<wasm::Literal,_4UL>::array((array<wasm::Literal,_4UL> *)&i);
  for (idx = 0; idx < 4; idx = idx + 1) {
    local_220 = idx + 4;
    pvVar3 = std::array<wasm::Literal,_8UL>::operator[]
                       ((array<wasm::Literal,_8UL> *)&rhs._M_elems[7].type,local_220);
    iVar1 = Literal::geti32(pvVar3);
    pvVar3 = std::array<wasm::Literal,_8UL>::operator[]
                       ((array<wasm::Literal,_8UL> *)local_1a0,local_220);
    iVar2 = Literal::geti32(pvVar3);
    Literal::Literal(&local_238,(int)(short)iVar1 * (int)(short)iVar2);
    this_00 = std::array<wasm::Literal,_4UL>::operator[]((array<wasm::Literal,_4UL> *)&i,idx);
    Literal::operator=(this_00,&local_238);
    Literal::~Literal(&local_238);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<4> *)&i);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&i);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_1a0);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&rhs._M_elems[7].type);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}